

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

Status google::protobuf::File::WriteStringToFile(string_view contents,string *name)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  const_pointer __ptr;
  size_type sVar4;
  size_t sVar5;
  FILE *in_RCX;
  AlphaNum *in_R9;
  string_view message;
  string_view message_00;
  string_view message_01;
  basic_string_view<char,_std::char_traits<char>_> local_230;
  AlphaNum local_220;
  AlphaNum local_1f0;
  AlphaNum local_1c0;
  AlphaNum local_190;
  string local_160;
  undefined1 local_140 [16];
  AlphaNum local_120;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  string local_60;
  undefined1 local_40 [16];
  FILE *local_30;
  FILE *file;
  string *name_local;
  string_view contents_local;
  
  name_local = (string *)contents._M_str;
  message._M_len = (char *)contents._M_len;
  file = in_RCX;
  contents_local._M_len = (size_t)name;
  contents_local._M_str = message._M_len;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_30 = fopen(pcVar2,"wb");
  if (local_30 == (FILE *)0x0) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_90,"fopen(");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)file);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_f0,", \"wb\"): ");
    piVar3 = __errno_location();
    pcVar2 = strerror(*piVar3);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_120,pcVar2);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_60,(lts_20250127 *)&local_90,&local_c0,&local_f0,&local_120,in_R9);
    local_40 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
    message._M_str = local_40._0_8_;
    absl::lts_20250127::InternalError(message);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    __ptr = std::basic_string_view<char,_std::char_traits<char>_>::data
                      ((basic_string_view<char,_std::char_traits<char>_> *)&name_local);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&name_local);
    sVar5 = fwrite(__ptr,1,sVar4,local_30);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&name_local);
    if (sVar5 == sVar4) {
      iVar1 = fclose(local_30);
      if (iVar1 == 0) {
        absl::lts_20250127::OkStatus();
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_230,"Failed to close file");
        message_01._M_str = (char *)local_230._M_len;
        message_01._M_len = (size_t)message._M_len;
        absl::lts_20250127::InternalError(message_01);
      }
    }
    else {
      fclose(local_30);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_190,"fwrite(");
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)file);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_1f0,"): ");
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_220,pcVar2);
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_160,(lts_20250127 *)&local_190,&local_1c0,&local_1f0,&local_220,in_R9);
      local_140 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_160);
      message_00._M_str = local_140._0_8_;
      message_00._M_len = (size_t)message._M_len;
      absl::lts_20250127::InternalError(message_00);
      std::__cxx11::string::~string((string *)&local_160);
    }
  }
  return (Status)(uintptr_t)message._M_len;
}

Assistant:

absl::Status File::WriteStringToFile(absl::string_view contents,
                                     const std::string& name) {
  FILE* file = fopen(name.c_str(), "wb");
  if (file == nullptr) {
    return absl::InternalError(
        absl::StrCat("fopen(", name, ", \"wb\"): ", strerror(errno)));
  }

  if (fwrite(contents.data(), 1, contents.size(), file) != contents.size()) {
    fclose(file);
    return absl::InternalError(
        absl::StrCat("fwrite(", name, "): ", strerror(errno)));
  }

  if (fclose(file) != 0) {
    return absl::InternalError("Failed to close file");
  }
  return absl::OkStatus();
}